

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_create_index.cpp
# Opt level: O2

TableCatalogEntry * __thiscall
duckdb::LogicalCreateIndex::BindTable
          (LogicalCreateIndex *this,ClientContext *context,CreateIndexInfo *info_p)

{
  TableCatalogEntry *pTVar1;
  
  pTVar1 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                     (context,&(info_p->super_CreateInfo).catalog,&(info_p->super_CreateInfo).schema
                      ,&info_p->table,(QueryErrorContext)0xffffffffffffffff);
  return pTVar1;
}

Assistant:

TableCatalogEntry &LogicalCreateIndex::BindTable(ClientContext &context, CreateIndexInfo &info_p) {
	auto &catalog = info_p.catalog;
	auto &schema = info_p.schema;
	auto &table_name = info_p.table;
	return Catalog::GetEntry<TableCatalogEntry>(context, catalog, schema, table_name);
}